

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZMCTargetDesc.c
# Opt level: O0

uint SystemZMC_getFirstReg(uint Reg)

{
  uint local_10;
  uint I;
  uint Reg_local;
  
  if (SystemZMC_getFirstReg::Initialized == 0) {
    SystemZMC_getFirstReg::Initialized = 1;
    for (local_10 = 0; local_10 < 0x10; local_10 = local_10 + 1) {
      SystemZMC_getFirstReg::Map[SystemZMC_GR32Regs[local_10]] = local_10;
      SystemZMC_getFirstReg::Map[SystemZMC_GRH32Regs[local_10]] = local_10;
      SystemZMC_getFirstReg::Map[SystemZMC_GR64Regs[local_10]] = local_10;
      SystemZMC_getFirstReg::Map[SystemZMC_GR128Regs[local_10]] = local_10;
      SystemZMC_getFirstReg::Map[SystemZMC_FP32Regs[local_10]] = local_10;
      SystemZMC_getFirstReg::Map[SystemZMC_FP64Regs[local_10]] = local_10;
      SystemZMC_getFirstReg::Map[SystemZMC_FP128Regs[local_10]] = local_10;
    }
  }
  return SystemZMC_getFirstReg::Map[Reg];
}

Assistant:

unsigned SystemZMC_getFirstReg(unsigned Reg)
{
	static unsigned Map[SystemZ_NUM_TARGET_REGS];
	static int Initialized = 0;
	unsigned I;

	if (!Initialized) {
		Initialized = 1;
		for (I = 0; I < 16; ++I) {
			Map[SystemZMC_GR32Regs[I]] = I;
			Map[SystemZMC_GRH32Regs[I]] = I;
			Map[SystemZMC_GR64Regs[I]] = I;
			Map[SystemZMC_GR128Regs[I]] = I;
			Map[SystemZMC_FP32Regs[I]] = I;
			Map[SystemZMC_FP64Regs[I]] = I;
			Map[SystemZMC_FP128Regs[I]] = I;
		}
	}

	// assert(Reg < SystemZ_NUM_TARGET_REGS);
	return Map[Reg];
}